

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O1

Aig_Obj_t * buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *pAigNew,ltlNode *pLtlNode)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  char *pcVar3;
  
  if (pLtlNode->pObj != (Aig_Obj_t *)0x0) {
    return pLtlNode->pObj;
  }
  switch(pLtlNode->type) {
  case AND:
    if (pLtlNode->left == (ltlNode *)0x0) {
      pcVar3 = "pLtlNode->left";
    }
    else {
      if (pLtlNode->right != (ltlNode_t *)0x0) {
        pAVar1 = buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode->left);
        pAVar2 = buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode->right);
        if (pAVar1 == (Aig_Obj_t *)0x0) {
          pcVar3 = "leftAigObj";
        }
        else {
          if (pAVar2 != (Aig_Obj_t *)0x0) {
            pAVar1 = Aig_And(pAigNew,pAVar1,pAVar2);
            goto LAB_006295e7;
          }
          pcVar3 = "rightAigObj";
        }
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x23c,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      pcVar3 = "pLtlNode->right";
    }
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                  ,0x239,
                  "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
  case OR:
    if (pLtlNode->left == (ltlNode *)0x0) {
      pcVar3 = "pLtlNode->left";
    }
    else {
      if (pLtlNode->right != (ltlNode_t *)0x0) {
        pAVar1 = buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode->left);
        pAVar2 = buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode->right);
        if (pAVar1 == (Aig_Obj_t *)0x0) {
          pcVar3 = "leftAigObj";
        }
        else {
          if (pAVar2 != (Aig_Obj_t *)0x0) {
            pAVar1 = Aig_Or(pAigNew,pAVar1,pAVar2);
            goto LAB_006295e7;
          }
          pcVar3 = "rightAigObj";
        }
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                      ,0x243,
                      "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
      }
      pcVar3 = "pLtlNode->right";
    }
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                  ,0x240,
                  "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
  case NOT:
    if (pLtlNode->left == (ltlNode *)0x0) {
      pcVar3 = "pLtlNode->left";
    }
    else {
      if (pLtlNode->right == (ltlNode_t *)0x0) {
        pAVar1 = buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode->left);
        if (pAVar1 == (Aig_Obj_t *)0x0) {
          __assert_fail("leftAigObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                        ,0x249,
                        "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)"
                       );
        }
        pAVar1 = (Aig_Obj_t *)((ulong)pAVar1 ^ 1);
LAB_006295e7:
        pLtlNode->pObj = pAVar1;
        return pAVar1;
      }
      pcVar3 = "pLtlNode->right == NULL";
    }
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                  ,0x247,
                  "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
  default:
    pcVar3 = "\nSerious ERROR: attempting to create AIG node from a temporal node";
    break;
  case GLOBALLY:
  case EVENTUALLY:
  case NEXT:
  case UNTIL:
    pcVar3 = "FORBIDDEN node: ABORTING!!";
    break;
  case BOOL:
    __assert_fail("pLtlNode->type != BOOL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/ltl_parser.c"
                  ,0x236,
                  "Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly(Aig_Man_t *, ltlNode *)");
  }
  puts(pcVar3);
  exit(0);
}

Assistant:

Aig_Obj_t *buildLogicFromLTLNode_combinationalOnly( Aig_Man_t *pAigNew, ltlNode *pLtlNode )
{
    Aig_Obj_t *leftAigObj, *rightAigObj;

    if( pLtlNode->pObj != NULL )
        return pLtlNode->pObj;
    else
    {
        assert( pLtlNode->type != BOOL );
        switch( pLtlNode->type ){
            case AND:
                assert( pLtlNode->left ); assert( pLtlNode->right );
                leftAigObj = buildLogicFromLTLNode_combinationalOnly( pAigNew, pLtlNode->left );
                rightAigObj = buildLogicFromLTLNode_combinationalOnly( pAigNew, pLtlNode->right );
                assert( leftAigObj ); assert( rightAigObj );
                pLtlNode->pObj = Aig_And( pAigNew, leftAigObj, rightAigObj );
                return pLtlNode->pObj;
            case OR:
                assert( pLtlNode->left ); assert( pLtlNode->right );
                leftAigObj = buildLogicFromLTLNode_combinationalOnly( pAigNew, pLtlNode->left );
                rightAigObj = buildLogicFromLTLNode_combinationalOnly( pAigNew, pLtlNode->right );
                assert( leftAigObj ); assert( rightAigObj );
                pLtlNode->pObj = Aig_Or( pAigNew, leftAigObj, rightAigObj );
                return pLtlNode->pObj;
            case NOT:
                assert( pLtlNode->left ); assert( pLtlNode->right == NULL ); 
                leftAigObj = buildLogicFromLTLNode_combinationalOnly( pAigNew, pLtlNode->left );
                assert( leftAigObj );
                pLtlNode->pObj = Aig_Not( leftAigObj );
                return pLtlNode->pObj;
            case GLOBALLY:
            case EVENTUALLY:
            case NEXT:
            case UNTIL:
                printf("FORBIDDEN node: ABORTING!!\n");
                exit(0);
            default:
                printf("\nSerious ERROR: attempting to create AIG node from a temporal node\n");
                exit(0);
        }
    }
}